

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortFun.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_14;
  int local_10;
  int c;
  int b;
  int a;
  
  std::operator<<((ostream *)&std::cout,"Please enter int a: ");
  std::istream::operator>>((istream *)&std::cin,&c);
  std::operator<<((ostream *)&std::cout,"Please enter int b: ");
  std::istream::operator>>((istream *)&std::cin,&local_10);
  std::operator<<((ostream *)&std::cout,"Please enter int c: ");
  std::istream::operator>>((istream *)&std::cin,&local_14);
  sort3(&c,&local_10,&local_14);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sorted values: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  sort3(&local_14,&c,&local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sorted values (c, a, b): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    int a;
    int b;
    int c;

    cout << "Please enter int a: ";
    cin >> a;
    cout << "Please enter int b: ";
    cin >> b;
    cout << "Please enter int c: ";
    cin >> c;

    sort3(a, b, c);

    cout << "Sorted values: " << a << " " << b << " " << c << endl;

    sort3(c, a, b);

    cout << "Sorted values (c, a, b): " << c << " " << a << " " << b << endl;

}